

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecode.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_bytecodeInterpreter_activateAndApply
          (sysbvm_context_t *context,sysbvm_tuple_t function_,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  long lVar1;
  _Bool _Var2;
  int iVar3;
  size_t __n;
  undefined8 uStack_390;
  void *local_388;
  sysbvm_tuple_t *inlineLocalVector;
  size_t requiredLocalVectorSize;
  sysbvm_functionBytecode_t **functionBytecodeObject;
  sysbvm_functionDefinition_t **functionDefinitionObject;
  sysbvm_function_t **functionObject;
  sysbvm_stackFrameBytecodeFunctionActivationRecord_t activationRecord;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t function__local;
  sysbvm_context_t *context_local;
  
  uStack_390 = 0x16487e;
  activationRecord.jmpbuffer[0].__saved_mask.__val[0xf] = (unsigned_long)arguments;
  memset(&functionObject,0,0x338);
  activationRecord.previous._0_4_ = 2;
  uStack_390 = 0x164894;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&functionObject);
  functionDefinitionObject = (sysbvm_functionDefinition_t **)&activationRecord.type;
  activationRecord.function = *(sysbvm_tuple_t *)(function_ + 0x48);
  functionBytecodeObject = (sysbvm_functionBytecode_t **)&activationRecord.function;
  activationRecord.functionDefinition = *(sysbvm_tuple_t *)(activationRecord.function + 0x80);
  requiredLocalVectorSize = (size_t)&activationRecord.functionDefinition;
  activationRecord.argumentCount = activationRecord.jmpbuffer[0].__saved_mask.__val[0xf];
  activationRecord.functionBytecode = *(sysbvm_tuple_t *)(function_ + 0x38);
  activationRecord.captureVector = *(sysbvm_tuple_t *)(activationRecord.functionDefinition + 0x28);
  activationRecord.literalVector = *(sysbvm_tuple_t *)(activationRecord.functionDefinition + 0x30);
  uStack_390 = 0x164963;
  activationRecord._8_8_ = function_;
  activationRecord.instructions = argumentCount;
  _Var2 = sysbvm_tuple_isBytes(activationRecord.literalVector);
  if (!_Var2) {
    uStack_390 = 0x164973;
    sysbvm_error_assertionFailure
              (
              "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/bytecode.c:557: assertion failure: sysbvm_tuple_isBytes(activationRecord.instructions)"
              );
  }
  activationRecord.result = 0;
  uStack_390 = 0x164991;
  inlineLocalVector =
       (sysbvm_tuple_t *)
       sysbvm_tuple_size_decode(*(sysbvm_tuple_t *)(*(long *)requiredLocalVectorSize + 0x20));
  lVar1 = -((long)inlineLocalVector * 8 + 0xfU & 0xfffffffffffffff0);
  __n = (long)inlineLocalVector << 3;
  local_388 = (void *)((long)&local_388 + lVar1);
  *(undefined8 *)((long)&uStack_390 + lVar1) = 0x1649d4;
  memset((void *)((long)&local_388 + lVar1),0,__n);
  activationRecord.arguments = inlineLocalVector;
  activationRecord.inlineLocalVectorSize = (size_t)local_388;
  *(undefined8 *)((long)&uStack_390 + lVar1) = 0x164a03;
  iVar3 = _setjmp((__jmp_buf_tag *)&activationRecord.pc);
  if (iVar3 == 0) {
    *(undefined8 *)((long)&uStack_390 + lVar1) = 0x164a18;
    sysbvm_bytecodeInterpreter_interpretWithActivationRecord
              (context,(sysbvm_stackFrameBytecodeFunctionActivationRecord_t *)&functionObject);
  }
  *(undefined8 *)((long)&uStack_390 + lVar1) = 0x164a24;
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&functionObject);
  return activationRecord.operandRegisterFile[0x3f];
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_bytecodeInterpreter_activateAndApply(sysbvm_context_t *context, sysbvm_tuple_t function_, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    sysbvm_stackFrameBytecodeFunctionActivationRecord_t activationRecord = {
        .type = SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_FUNCTION_ACTIVATION,
    };
    sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t*)&activationRecord);  

    activationRecord.function = function_;
    sysbvm_function_t **functionObject = (sysbvm_function_t**)&activationRecord.function;
    
    activationRecord.functionDefinition = (*functionObject)->definition;
    sysbvm_functionDefinition_t **functionDefinitionObject = (sysbvm_functionDefinition_t**)&activationRecord.functionDefinition;

    activationRecord.functionBytecode = (*functionDefinitionObject)->bytecode;
    sysbvm_functionBytecode_t **functionBytecodeObject = (sysbvm_functionBytecode_t **)&activationRecord.functionBytecode;

    activationRecord.argumentCount = argumentCount;
    activationRecord.arguments = arguments;

    activationRecord.captureVector = (*functionObject)->captureVector;
    activationRecord.literalVector = (*functionBytecodeObject)->literalVector;
    activationRecord.instructions = (*functionBytecodeObject)->instructions;
    SYSBVM_ASSERT(sysbvm_tuple_isBytes(activationRecord.instructions));

    // Set the initial PC.
    activationRecord.pc = 0;

    // Allocate the inline local vector.
    size_t requiredLocalVectorSize = sysbvm_tuple_size_decode((*functionBytecodeObject)->localVectorSize);
    sysbvm_tuple_t *inlineLocalVector = (sysbvm_tuple_t *)alloca(requiredLocalVectorSize * sizeof(sysbvm_tuple_t));
    memset(inlineLocalVector, 0, requiredLocalVectorSize * sizeof(sysbvm_tuple_t));

    activationRecord.inlineLocalVectorSize = requiredLocalVectorSize;
    activationRecord.inlineLocalVector = inlineLocalVector;

    // Interpret.
    if(!_setjmp(activationRecord.jmpbuffer))
        sysbvm_bytecodeInterpreter_interpretWithActivationRecord(context, &activationRecord);

    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t*)&activationRecord);
    return activationRecord.result;
}